

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,cmGeneratorTarget *target,char *filename)

{
  cmMakefile *this_00;
  string *psVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  string sStack_318;
  string cleanfile;
  string fc;
  string local_2a8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_288;
  char *local_280;
  cmGeneratorTarget *local_278;
  string cleanfilePath;
  string currentBinDir;
  ofstream fout;
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&currentBinDir,(string *)psVar1);
  std::__cxx11::string::string((string *)&cleanfile,(string *)&currentBinDir);
  std::__cxx11::string::append((char *)&cleanfile);
  (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xc])
            (&fout,this,target);
  std::__cxx11::string::append((string *)&cleanfile);
  std::__cxx11::string::~string((string *)&fout);
  std::__cxx11::string::append((char *)&cleanfile);
  if (filename != (char *)0x0) {
    std::__cxx11::string::append((char *)&cleanfile);
    std::__cxx11::string::append((char *)&cleanfile);
  }
  std::__cxx11::string::append((char *)&cleanfile);
  cmsys::SystemTools::CollapseFullPath(&cleanfilePath,&cleanfile);
  std::ofstream::ofstream(&fout,cleanfilePath._M_dataplus._M_p,_S_out);
  if (((&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
      != 0) {
    std::operator+(&fc,"Could not create ",&cleanfilePath);
    cmSystemTools::Error(&fc);
    std::__cxx11::string::~string((string *)&fc);
  }
  if ((files->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,"file(REMOVE_RECURSE\n"
                   );
    local_288 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands;
    local_280 = filename;
    local_278 = target;
    for (p_Var3 = (files->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(files->_M_t)._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      cmLocalGenerator::MaybeConvertToRelativePath
                (&fc,(cmLocalGenerator *)this,&currentBinDir,(string *)(p_Var3 + 1));
      poVar2 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,"  ");
      cmOutputConverter::EscapeForCMake(&sStack_318,&fc);
      poVar2 = std::operator<<(poVar2,(string *)&sStack_318);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&sStack_318);
      std::__cxx11::string::~string((string *)&fc);
    }
    std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,")\n");
    commands = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_288;
    target = local_278;
    filename = local_280;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fc,"$(CMAKE_COMMAND) -P ",(allocator<char> *)&sStack_318);
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmLocalGenerator::MaybeConvertToRelativePath
            (&local_2a8,(cmLocalGenerator *)this,psVar1,&cleanfile);
  cmOutputConverter::ConvertToOutputFormat
            (&sStack_318,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &local_2a8,SHELL);
  std::__cxx11::string::append((string *)&fc);
  std::__cxx11::string::~string((string *)&sStack_318);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,&fc);
  std::__cxx11::string::~string((string *)&fc);
  if (filename == (char *)0x0) {
    fc.field_2._8_8_ = &fc._M_string_length;
    fc._M_string_length._0_4_ = 0;
    fc.field_2._M_allocated_capacity = 0;
    this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_318,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_2a8);
    psVar1 = cmMakefile::GetSafeDefinition(this_00,&sStack_318);
    cmGeneratorTarget::GetLanguages
              (target,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&fc,psVar1);
    std::__cxx11::string::~string((string *)&sStack_318);
    poVar2 = std::operator<<(&fout.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    poVar2 = std::operator<<(poVar2,"# Per-language clean rules from dependency scanning.\n");
    poVar2 = std::operator<<(poVar2,"foreach(lang ");
    cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              (&sStack_318,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&fc," ");
    poVar2 = std::operator<<(poVar2,(string *)&sStack_318);
    poVar2 = std::operator<<(poVar2,")\n");
    poVar2 = std::operator<<(poVar2,"  include(");
    (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[0xc])
              (&local_2a8,this,target);
    poVar2 = std::operator<<(poVar2,(string *)&local_2a8);
    poVar2 = std::operator<<(poVar2,"/cmake_clean_${lang}.cmake OPTIONAL)\n");
    std::operator<<(poVar2,"endforeach()\n");
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&sStack_318);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&fc);
  }
  std::ofstream::~ofstream(&fout);
  std::__cxx11::string::~string((string *)&cleanfilePath);
  std::__cxx11::string::~string((string *)&cleanfile);
  std::__cxx11::string::~string((string *)&currentBinDir);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCleanCommand(
  std::vector<std::string>& commands, const std::set<std::string>& files,
  cmGeneratorTarget* target, const char* filename)
{
  std::string currentBinDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile = currentBinDir;
  cleanfile += "/";
  cleanfile += this->GetTargetDirectory(target);
  cleanfile += "/cmake_clean";
  if (filename) {
    cleanfile += "_";
    cleanfile += filename;
  }
  cleanfile += ".cmake";
  std::string cleanfilePath = cmSystemTools::CollapseFullPath(cleanfile);
  cmsys::ofstream fout(cleanfilePath.c_str());
  if (!fout) {
    cmSystemTools::Error("Could not create " + cleanfilePath);
  }
  if (!files.empty()) {
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& file : files) {
      std::string fc = this->MaybeConvertToRelativePath(currentBinDir, file);
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  {
    std::string remove = "$(CMAKE_COMMAND) -P ";
    remove += this->ConvertToOutputFormat(
      this->MaybeConvertToRelativePath(this->GetCurrentBinaryDirectory(),
                                       cleanfile),
      cmOutputConverter::SHELL);
    commands.push_back(std::move(remove));
  }

  // For the main clean rule add per-language cleaning.
  if (!filename) {
    // Get the set of source languages in the target.
    std::set<std::string> languages;
    target->GetLanguages(
      languages, this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    /* clang-format off */
    fout << "\n"
         << "# Per-language clean rules from dependency scanning.\n"
         << "foreach(lang " << cmJoin(languages, " ") << ")\n"
         << "  include(" << this->GetTargetDirectory(target)
         << "/cmake_clean_${lang}.cmake OPTIONAL)\n"
         << "endforeach()\n";
    /* clang-format on */
  }
}